

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O0

void __thiscall
booster::locale::basic_message<char>::swap(basic_message<char> *this,basic_message<char> *other)

{
  int *in_RSI;
  int *in_RDI;
  
  std::swap<int>(in_RDI,in_RSI);
  std::swap<char_const*>((char **)(in_RDI + 2),(char **)(in_RSI + 2));
  std::swap<char_const*>((char **)(in_RDI + 4),(char **)(in_RSI + 4));
  std::swap<char_const*>((char **)(in_RDI + 6),(char **)(in_RSI + 6));
  std::__cxx11::string::swap((string *)(in_RDI + 8));
  std::__cxx11::string::swap((string *)(in_RDI + 0x10));
  std::__cxx11::string::swap((string *)(in_RDI + 0x18));
  return;
}

Assistant:

void swap(basic_message &other)
            {
                std::swap(n_,other.n_);
                std::swap(c_id_,other.c_id_);
                std::swap(c_context_,other.c_context_);
                std::swap(c_plural_,other.c_plural_);

                id_.swap(other.id_);
                context_.swap(other.context_);
                plural_.swap(other.plural_);
            }